

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

size_t __thiscall Assimp::Importer::GetImporterIndex(Importer *this,char *szExtension)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  long *__s1;
  int iVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  char cVar7;
  size_t sVar8;
  pointer ppBVar9;
  string ext;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  long *local_80;
  _Base_ptr local_78;
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x3b9,"size_t Assimp::Importer::GetImporterIndex(const char *) const");
  }
  if (szExtension == (char *)0x0) {
    __assert_fail("nullptr != szExtension",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x3ba,"size_t Assimp::Importer::GetImporterIndex(const char *) const");
  }
  for (; (byte)(*szExtension | 4U) == 0x2e; szExtension = (char *)((byte *)szExtension + 1)) {
  }
  local_80 = local_70;
  sVar4 = strlen(szExtension);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,szExtension,(byte *)szExtension + sVar4);
  if (local_78 == (_Base_ptr)0x0) {
    sVar8 = 0xffffffffffffffff;
  }
  else {
    p_Var6 = (_Base_ptr)0x0;
    do {
      cVar2 = *(char *)((long)local_80 + (long)p_Var6);
      cVar7 = cVar2 + ' ';
      if (0x19 < (byte)(cVar2 + 0xbfU)) {
        cVar7 = cVar2;
      }
      *(char *)((long)local_80 + (long)p_Var6) = cVar7;
      p_Var6 = (_Base_ptr)((long)&p_Var6->_M_color + 1);
    } while (local_78 != p_Var6);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppBVar9 = (this->pimpl->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar8 = 0xffffffffffffffff;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (ppBVar9 !=
        (this->pimpl->mImporter).
        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&local_60);
        BaseImporter::GetExtensionList
                  (*ppBVar9,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_60);
        p_Var6 = local_78;
        __s1 = local_80;
        for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != p_Var1;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          if ((p_Var6 == p_Var5[1]._M_parent) &&
             ((p_Var6 == (_Base_ptr)0x0 ||
              (iVar3 = bcmp(__s1,*(void **)(p_Var5 + 1),(size_t)p_Var6), iVar3 == 0)))) {
            sVar8 = (long)ppBVar9 -
                    (long)(this->pimpl->mImporter).
                          super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
            goto LAB_002ecb97;
          }
        }
        ppBVar9 = ppBVar9 + 1;
      } while (ppBVar9 !=
               (this->pimpl->mImporter).
               super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      sVar8 = 0xffffffffffffffff;
    }
LAB_002ecb97:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return sVar8;
}

Assistant:

size_t Importer::GetImporterIndex (const char* szExtension) const {
    ai_assert(nullptr != pimpl);
    ai_assert(nullptr != szExtension);

    ASSIMP_BEGIN_EXCEPTION_REGION();

    // skip over wildcard and dot characters at string head --
    for ( ; *szExtension == '*' || *szExtension == '.'; ++szExtension );

    std::string ext(szExtension);
    if (ext.empty()) {
        return static_cast<size_t>(-1);
    }
    std::transform( ext.begin(), ext.end(), ext.begin(), ToLower<char> );

    std::set<std::string> str;
    for (std::vector<BaseImporter*>::const_iterator i =  pimpl->mImporter.begin();i != pimpl->mImporter.end();++i)  {
        str.clear();

        (*i)->GetExtensionList(str);
        for (std::set<std::string>::const_iterator it = str.begin(); it != str.end(); ++it) {
            if (ext == *it) {
                return std::distance(static_cast< std::vector<BaseImporter*>::const_iterator >(pimpl->mImporter.begin()), i);
            }
        }
    }
    ASSIMP_END_EXCEPTION_REGION(size_t);
    return static_cast<size_t>(-1);
}